

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O0

AppleAcceleratorTable * __thiscall llvm::DWARFContext::getAppleNamespaces(DWARFContext *this)

{
  StringRef StringSection;
  bool IsLittleEndian;
  int iVar1;
  int iVar2;
  type Obj;
  pointer pDVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  AppleAcceleratorTable *pAVar4;
  size_t extraout_RDX;
  DWARFContext *this_local;
  
  Obj = std::unique_ptr<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>::
        operator*(&this->DObj);
  pDVar3 = std::unique_ptr<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>::
           operator->(&this->DObj);
  iVar1 = (*pDVar3->_vptr_DWARFObject[0x26])();
  pDVar3 = std::unique_ptr<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>::
           operator->(&this->DObj);
  iVar2 = (*pDVar3->_vptr_DWARFObject[0x11])();
  StringSection.Data._4_4_ = extraout_var_00;
  StringSection.Data._0_4_ = iVar2;
  IsLittleEndian = isLittleEndian(this);
  StringSection.Length = extraout_RDX;
  pAVar4 = getAccelTable<llvm::AppleAcceleratorTable>
                     (&this->AppleNamespaces,Obj,(DWARFSection *)CONCAT44(extraout_var,iVar1),
                      StringSection,IsLittleEndian);
  return pAVar4;
}

Assistant:

const AppleAcceleratorTable &DWARFContext::getAppleNamespaces() {
  return getAccelTable(AppleNamespaces, *DObj,
                       DObj->getAppleNamespacesSection(),
                       DObj->getStrSection(), isLittleEndian());
}